

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall FastPForLib::FastPFor<8U>::~FastPFor(FastPFor<8U> *this)

{
  FastPForImpl<8U,_unsigned_int> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_encodeArray_004789a8;
  FastPForImpl<8U,_unsigned_long>::~FastPForImpl((FastPForImpl<8U,_unsigned_long> *)in_RDI);
  FastPForImpl<8U,_unsigned_int>::~FastPForImpl(in_RDI);
  IntegerCODEC::~IntegerCODEC((IntegerCODEC *)in_RDI);
  return;
}

Assistant:

FastPFor(uint32_t pageSize = 65536) : pfor32(pageSize) {}